

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O1

FloatConstantKind spvtools::opt::anon_unknown_0::getFloatConstantKind(Constant *constant)

{
  bool bVar1;
  int iVar2;
  FloatConstantKind FVar3;
  FloatConstantKind FVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  long lVar6;
  FloatConstant *this;
  undefined4 extraout_var_02;
  ulong uVar7;
  float fVar8;
  double dVar9;
  undefined4 extraout_var_01;
  
  if (constant != (Constant *)0x0) {
    bVar1 = HasFloatingPoint(constant->type_);
    if (!bVar1) {
      __assert_fail("HasFloatingPoint(constant->type()) && \"Unexpected constant type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x903,
                    "FloatConstantKind spvtools::opt::(anonymous namespace)::getFloatConstantKind(const analysis::Constant *)"
                   );
    }
    iVar2 = (*constant->_vptr_Constant[0x16])(constant);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      return Zero;
    }
    iVar2 = (*constant->_vptr_Constant[0x13])(constant);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (plVar5 == (long *)0x0) {
      iVar2 = (*constant->_vptr_Constant[0xf])(constant);
      this = (FloatConstant *)CONCAT44(extraout_var_01,iVar2);
      if (this != (FloatConstant *)0x0) {
        iVar2 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x17])(this);
        if ((char)iVar2 != '\0') {
          return Zero;
        }
        iVar2 = (*((this->super_ScalarConstant).super_Constant.type_)->_vptr_Type[0xc])();
        iVar2 = *(int *)(CONCAT44(extraout_var_02,iVar2) + 0x24);
        if (iVar2 == 0x20) {
          fVar8 = analysis::FloatConstant::GetFloatValue(this);
          dVar9 = (double)fVar8;
        }
        else {
          if (iVar2 != 0x40) {
            return Unknown;
          }
          dVar9 = analysis::FloatConstant::GetDoubleValue(this);
        }
        FVar3 = (-(uint)(dVar9 == 1.0) & 1) * 2;
        FVar4 = Zero;
        if (dVar9 != 0.0) {
          FVar4 = FVar3;
        }
        if (!NAN(dVar9)) {
          return FVar4;
        }
        return FVar3;
      }
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0xc0))(plVar5);
      if ((undefined8 *)*plVar5 == (undefined8 *)plVar5[1]) {
        __assert_fail("!components.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x90b,
                      "FloatConstantKind spvtools::opt::(anonymous namespace)::getFloatConstantKind(const analysis::Constant *)"
                     );
      }
      FVar3 = getFloatConstantKind(*(Constant **)*plVar5);
      lVar6 = *plVar5;
      if ((ulong)(plVar5[1] - lVar6) < 9) {
        return FVar3;
      }
      uVar7 = 1;
      while (FVar4 = getFloatConstantKind(*(Constant **)(lVar6 + uVar7 * 8)), FVar4 == FVar3) {
        uVar7 = uVar7 + 1;
        lVar6 = *plVar5;
        if ((ulong)(plVar5[1] - lVar6 >> 3) <= uVar7) {
          return FVar3;
        }
      }
    }
  }
  return Unknown;
}

Assistant:

FloatConstantKind getFloatConstantKind(const analysis::Constant* constant) {
  if (constant == nullptr) {
    return FloatConstantKind::Unknown;
  }

  assert(HasFloatingPoint(constant->type()) && "Unexpected constant type");

  if (constant->AsNullConstant()) {
    return FloatConstantKind::Zero;
  } else if (const analysis::VectorConstant* vc =
                 constant->AsVectorConstant()) {
    const std::vector<const analysis::Constant*>& components =
        vc->GetComponents();
    assert(!components.empty());

    FloatConstantKind kind = getFloatConstantKind(components[0]);

    for (size_t i = 1; i < components.size(); ++i) {
      if (getFloatConstantKind(components[i]) != kind) {
        return FloatConstantKind::Unknown;
      }
    }

    return kind;
  } else if (const analysis::FloatConstant* fc = constant->AsFloatConstant()) {
    if (fc->IsZero()) return FloatConstantKind::Zero;

    uint32_t width = fc->type()->AsFloat()->width();
    if (width != 32 && width != 64) return FloatConstantKind::Unknown;

    double value = (width == 64) ? fc->GetDoubleValue() : fc->GetFloatValue();

    if (value == 0.0) {
      return FloatConstantKind::Zero;
    } else if (value == 1.0) {
      return FloatConstantKind::One;
    } else {
      return FloatConstantKind::Unknown;
    }
  } else {
    return FloatConstantKind::Unknown;
  }
}